

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  cTValue *pcVar1;
  cTValue *pcVar2;
  double dVar3;
  cTValue *local_60;
  cTValue *mo;
  cTValue *c;
  cTValue *b;
  TValue tempc;
  TValue tempb;
  MMS mm;
  BCReg op_local;
  cTValue *rc_local;
  cTValue *rb_local;
  TValue *ra_local;
  lua_State *L_local;
  
  tempb.field_4.i = (int)(uint)lj_bc_mode[op] >> 0xb;
  tempb.field_4.it = op;
  _mm = rc;
  rc_local = rb;
  rb_local = ra;
  ra_local = (TValue *)L;
  pcVar1 = str2num(rb,&tempc);
  if ((pcVar1 == (cTValue *)0x0) || (pcVar2 = str2num(_mm,(TValue *)&b), pcVar2 == (cTValue *)0x0))
  {
    local_60 = lj_meta_lookup((lua_State *)&ra_local->gcr,rc_local,tempb.u32.lo);
    if ((local_60->u64 == 0xffffffffffffffff) &&
       (local_60 = lj_meta_lookup((lua_State *)&ra_local->gcr,_mm,tempb.u32.lo),
       local_60->u64 == 0xffffffffffffffff)) {
      pcVar1 = str2num(rc_local,&tempc);
      if (pcVar1 == (cTValue *)0x0) {
        _mm = rc_local;
      }
      lj_err_optype((lua_State *)&ra_local->gcr,_mm,LJ_ERR_OPARITH);
    }
    L_local = (lua_State *)mmcall((lua_State *)&ra_local->gcr,lj_cont_ra,local_60,rc_local,_mm);
  }
  else {
    dVar3 = lj_vm_foldarith(pcVar1->n,pcVar2->n,tempb.field_4.i + -10);
    rb_local->n = dVar3;
    L_local = (lua_State *)0x0;
  }
  return (TValue *)L_local;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}